

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O0

void __thiscall
TEST_MockComparatorCopierTest_twoDifferentCustomTypeOutputParametersInSameFunctionCallSucceeds_TestShell
::
~TEST_MockComparatorCopierTest_twoDifferentCustomTypeOutputParametersInSameFunctionCallSucceeds_TestShell
          (TEST_MockComparatorCopierTest_twoDifferentCustomTypeOutputParametersInSameFunctionCallSucceeds_TestShell
           *this)

{
  TEST_MockComparatorCopierTest_twoDifferentCustomTypeOutputParametersInSameFunctionCallSucceeds_TestShell
  *this_local;
  
  ~TEST_MockComparatorCopierTest_twoDifferentCustomTypeOutputParametersInSameFunctionCallSucceeds_TestShell
            (this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockComparatorCopierTest, twoDifferentCustomTypeOutputParametersInSameFunctionCallSucceeds)
{
    MyTypeForTesting expectedObject1(11);
    MyTypeForTesting actualObject1(22);
    MyTypeForTesting expectedObject2(33);
    MyTypeForTesting actualObject2(44);
    MyTypeForTestingCopier copier;
    mock().installCopier("MyTypeForTesting", copier);

    mock().expectOneCall("foo")
        .withOutputParameterOfTypeReturning("MyTypeForTesting", "bar", &expectedObject1)
        .withOutputParameterOfTypeReturning("MyTypeForTesting", "foobar", &expectedObject2);
    mock().actualCall("foo")
        .withOutputParameterOfType("MyTypeForTesting", "bar", &actualObject1)
        .withOutputParameterOfType("MyTypeForTesting", "foobar", &actualObject2);

    mock().checkExpectations();
    CHECK_EQUAL(11, *(expectedObject1.value));
    CHECK_EQUAL(11, *(actualObject1.value));
    CHECK_EQUAL(33, *(expectedObject2.value));
    CHECK_EQUAL(33, *(actualObject2.value));

    mock().removeAllComparatorsAndCopiers();
}